

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

Node * __thiscall
wasm::DataFlow::Graph::makeZeroComp(Graph *this,Node *node,bool equal,Expression *origin)

{
  BinaryOp op;
  Type type;
  Module *node_00;
  Expression *left;
  Expression *right;
  Binary *expr;
  Node *pNVar1;
  Graph *this_00;
  Builder local_48;
  Builder builder;
  
  if (node->type != Bad) {
    local_48.wasm = this->module;
    type = Node::getWasmType(node);
    this_00 = this;
    if (1 < type.id) {
      node_00 = (Module *)makeZero(this,type);
      builder.wasm = node_00;
      op = Abstract::getBinary(type,equal ^ Ne);
      left = makeUse(this,node);
      right = makeUse(this,(Node *)node_00);
      expr = Builder::makeBinary(&local_48,op,left,right);
      pNVar1 = Node::makeExpr((Expression *)expr,origin);
      this_00 = (Graph *)addNode(this,pNVar1);
      pNVar1 = expandFromI1(this,node,origin);
      Node::addValue((Node *)this_00,pNVar1);
      Node::addValue((Node *)this_00,(Node *)builder.wasm);
    }
    return &this_00->bad;
  }
  __assert_fail("!node->isBad()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/dataflow/graph.h"
                ,0xa7,"Node *wasm::DataFlow::Graph::makeZeroComp(Node *, bool, Expression *)");
}

Assistant:

Node* makeZeroComp(Node* node, bool equal, Expression* origin) {
    assert(!node->isBad());
    Builder builder(*module);
    auto type = node->getWasmType();
    if (!type.isConcrete()) {
      return &bad;
    }
    auto* zero = makeZero(type);
    auto* expr = builder.makeBinary(
      Abstract::getBinary(type, equal ? Abstract::Eq : Abstract::Ne),
      makeUse(node),
      makeUse(zero));
    auto* check = addNode(Node::makeExpr(expr, origin));
    check->addValue(expandFromI1(node, origin));
    check->addValue(zero);
    return check;
  }